

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O0

string * __thiscall
lan::db::write_array_bit_abi_cxx11_(string *__return_storage_ptr__,db *this,db_bit *bits)

{
  long lVar1;
  string local_88;
  byte local_52;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_29;
  db_bit *local_28;
  db_bit *buffer;
  db_bit *bits_local;
  db *this_local;
  string *bits_str;
  
  local_28 = bits->lin;
  local_29 = 0;
  buffer = bits;
  bits_local = (db_bit *)this;
  this_local = (db *)__return_storage_ptr__;
  lVar1 = std::__cxx11::string::length();
  local_52 = 0;
  if (lVar1 == 0) {
    std::allocator<char>::allocator();
    local_52 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
  }
  else {
    std::operator+(&local_50,&buffer->key,"=");
  }
  std::operator+(__return_storage_ptr__,&local_50,"a:[");
  std::__cxx11::string::~string((string *)&local_50);
  if ((local_52 & 1) != 0) {
    std::allocator<char>::~allocator(&local_51);
  }
  while (local_28 != (db_bit *)0x0) {
    write_bit_abi_cxx11_(&local_88,this,local_28,true);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    local_28 = local_28->nex;
    if (local_28 != (db_bit *)0x0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,' ');
    }
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"]");
  return __return_storage_ptr__;
}

Assistant:

std::string db::write_array_bit(db_bit * bits){
            db_bit * buffer = bits->lin;
            std::string bits_str = ((bits->key.length()) ? bits->key + "=" : "") + "a:[";
            while(buffer){
                bits_str += write_bit(buffer, true);
                buffer = buffer->nex;
                if(buffer)bits_str += (' ');
            } bits_str += "]";
            return bits_str;
        }